

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldsTable.cpp
# Opt level: O0

string * __thiscall
ser::FieldsTable::ToString_abi_cxx11_(string *__return_storage_ptr__,FieldsTable *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  string local_1d0;
  _Self local_1b0;
  _Self local_1a8;
  const_iterator iter;
  ostringstream local_190 [8];
  ostringstream ss;
  FieldsTable *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,"FieldsTable [\n");
  local_1a8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
       ::begin(&this->data_);
  while( true ) {
    local_1b0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>_>
         ::end(&this->data_);
    bVar1 = std::operator!=(&local_1a8,&local_1b0);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)local_190,"    ");
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>
             ::operator->(&local_1a8);
    DataFieldInfo::ToString_abi_cxx11_(&local_1d0,&ppVar3->second);
    poVar2 = std::operator<<(poVar2,(string *)&local_1d0);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_1d0);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ser::DataFieldInfo>_>
    ::operator++(&local_1a8);
  }
  std::operator<<((ostream *)local_190,"]\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldsTable::ToString() const
{
    std::ostringstream ss;
    ss << "FieldsTable [\n";
    for (std::map<std::string, DataFieldInfo>::const_iterator iter = data_.begin(); iter != data_.end(); ++iter)
    {
        ss << "    " << iter->second.ToString() << "\n";
    }
    ss << "]\n";
    return ss.str();
}